

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conway-cubes.cpp
# Opt level: O3

rect_t<char> *
read_rect(rect_t<char> *__return_storage_ptr__,
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *lines)

{
  pointer pbVar1;
  pointer pcVar2;
  void *pvVar3;
  pointer pcVar4;
  ulong uVar5;
  pointer pvVar6;
  long lVar7;
  pointer pbVar8;
  line_t<char> line;
  allocator_type local_49;
  vector<char,_std::allocator<char>_> local_48;
  
  std::
  vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,
           (long)(lines->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(lines->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_48);
  pbVar8 = (lines->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (lines->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar8 != pbVar1) {
    pvVar6 = (__return_storage_ptr__->
             super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    do {
      std::vector<char,_std::allocator<char>_>::vector(&local_48,pbVar8->_M_string_length,&local_49)
      ;
      if (0 < (long)pbVar8->_M_string_length) {
        pcVar2 = (pbVar8->_M_dataplus)._M_p;
        uVar5 = pbVar8->_M_string_length + 1;
        lVar7 = 0;
        do {
          local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar7] = pcVar2[lVar7];
          uVar5 = uVar5 - 1;
          lVar7 = lVar7 + 1;
        } while (1 < uVar5);
      }
      pvVar3 = (pvVar6->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pcVar4 = *(pointer *)
                ((long)&(pvVar6->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data + 0x10);
      (pvVar6->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_start = local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&(pvVar6->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data + 8) =
           local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      *(pointer *)
       ((long)&(pvVar6->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data + 0x10) =
           local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
      local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3,(long)pcVar4 - (long)pvVar3);
        if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
            ._M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      pbVar8 = pbVar8 + 1;
      pvVar6 = pvVar6 + 1;
    } while (pbVar8 != pbVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

rect_t<char> read_rect(const std::vector<std::string>& lines) {
  auto rect = rect_t<char> (lines.size());

  ranges::transform(lines, rect.begin(), [](const std::string& l){
    auto line = line_t<char> (l.size());
    ranges::copy(l, line.begin());
    return line;
  });

  return rect;
}